

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_contact.h
# Opt level: O2

void __thiscall
GIM_CONTACT::interpolate_normals(GIM_CONTACT *this,btVector3 *normals,uint normal_count)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  float fVar4;
  long lVar5;
  btScalar bVar6;
  btVector3 local_18;
  
  uVar1 = *(undefined8 *)(this->m_normal).m_floats;
  uVar3 = *(undefined8 *)((this->m_normal).m_floats + 2);
  local_18.m_floats[0] = (btScalar)uVar1;
  local_18.m_floats[1] = (btScalar)((ulong)uVar1 >> 0x20);
  local_18.m_floats[2] = (btScalar)uVar3;
  for (lVar5 = 0; (ulong)normal_count << 4 != lVar5; lVar5 = lVar5 + 0x10) {
    uVar1 = *(undefined8 *)((long)normals->m_floats + lVar5);
    local_18.m_floats[0] = local_18.m_floats[0] + (float)uVar1;
    local_18.m_floats[1] = local_18.m_floats[1] + (float)((ulong)uVar1 >> 0x20);
    local_18.m_floats[2] = local_18.m_floats[2] + *(float *)((long)normals->m_floats + lVar5 + 8);
  }
  local_18.m_floats[3] = (btScalar)((ulong)uVar3 >> 0x20);
  bVar6 = btVector3::length2(&local_18);
  if (1e-05 <= bVar6) {
    if (bVar6 <= 1e-07) {
      fVar4 = 3.4028235e+38;
    }
    else {
      fVar4 = (float)(0x5f3759df - ((uint)bVar6 >> 1));
      fVar4 = (bVar6 * -0.5 * fVar4 * fVar4 + 1.5) * fVar4;
    }
    auVar2._4_4_ = fVar4 * local_18.m_floats[1];
    auVar2._0_4_ = fVar4 * local_18.m_floats[0];
    auVar2._8_4_ = fVar4 * local_18.m_floats[2];
    auVar2._12_4_ = 0;
    *(undefined1 (*) [16])(this->m_normal).m_floats = auVar2;
  }
  return;
}

Assistant:

SIMD_FORCE_INLINE void interpolate_normals( btVector3 * normals,GUINT normal_count)
    {
    	btVector3 vec_sum(m_normal);
		for(GUINT i=0;i<normal_count;i++)
		{
			vec_sum += normals[i];
		}

		GREAL vec_sum_len = vec_sum.length2();
		if(vec_sum_len <CONTACT_DIFF_EPSILON) return;

		GIM_INV_SQRT(vec_sum_len,vec_sum_len); // 1/sqrt(vec_sum_len)

		m_normal = vec_sum*vec_sum_len;
    }